

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [12];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined4 uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  size_t itime;
  ulong uVar43;
  float fVar44;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar45;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar72;
  float fVar73;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar96;
  float fVar97;
  Vec3fa dn1;
  float fVar98;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar99;
  float fVar100;
  float fVar108;
  float fVar109;
  undefined1 auVar101 [16];
  float fVar110;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  vfloat4 b0;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar114;
  float fVar117;
  float fVar118;
  vfloat4 a0_1;
  float fVar119;
  undefined1 auVar115 [16];
  float fVar120;
  undefined1 auVar116 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar124 [64];
  vfloat4 a0;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar145;
  float fVar147;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar146;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar150;
  float fVar152;
  Vec3fa n0;
  undefined1 auVar148 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  undefined1 auVar149 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar167;
  float fVar169;
  float fVar170;
  Vec3fa n1;
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  size_t local_2c0;
  size_t local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  ulong local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  anon_class_16_2_07cfa4d6 local_1a8;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_278._8_4_ = 0x7f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_278._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_288._8_4_ = 0xff800000;
  local_288._0_8_ = 0xff800000ff800000;
  local_288._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar46._8_8_ = 0;
  auVar46._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar46._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar63._8_8_ = 0;
  auVar63._0_4_ = time_range->lower;
  auVar63._4_4_ = time_range->upper;
  auVar56 = vcmpps_avx(auVar46,auVar63,1);
  auVar47 = vinsertps_avx(auVar63,auVar46,0x50);
  auVar46 = vinsertps_avx(auVar46,auVar63,0x50);
  auVar56 = vblendvps_avx(auVar46,auVar47,auVar56);
  auVar47 = vmovshdup_avx(auVar56);
  fVar99 = auVar56._0_4_;
  fVar111 = auVar47._0_4_;
  if (fVar99 <= fVar111) {
    uVar43 = r->_begin;
    if (uVar43 < r->_end) {
      local_2c0 = 0;
      auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
      local_2a8._8_4_ = 0x7f800000;
      local_2a8._0_8_ = 0x7f8000007f800000;
      local_2a8._12_4_ = 0x7f800000;
      local_278._8_4_ = 0x7f800000;
      local_278._0_8_ = 0x7f8000007f800000;
      local_278._12_4_ = 0x7f800000;
      local_298._8_4_ = 0xff800000;
      local_298._0_8_ = 0xff800000ff800000;
      local_298._12_4_ = 0xff800000;
      local_288._8_4_ = 0xff800000;
      local_288._0_8_ = 0xff800000ff800000;
      local_288._12_4_ = 0xff800000;
      local_2b0 = k;
      do {
        auVar46 = auVar124._0_16_;
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar47._8_8_ = 0;
        auVar47._0_4_ = BVar2.lower;
        auVar47._4_4_ = BVar2.upper;
        auVar56 = vmovshdup_avx(auVar47);
        fVar44 = BVar2.lower;
        fVar45 = auVar56._0_4_ - fVar44;
        uVar3 = *(uint *)(*(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.field_0x68 * uVar43);
        uVar37 = (ulong)uVar3;
        uVar38 = (ulong)(uVar3 + 1);
        pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        auVar56 = _local_1e8;
        uVar35 = _local_1c8;
        if (uVar38 < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar56 = ZEXT416((uint)(fVar1 * ((fVar99 - fVar44) / fVar45) * 1.0000002));
          auVar56 = vroundss_avx(auVar56,auVar56,9);
          auVar56 = vmaxss_avx(auVar46,auVar56);
          auVar63 = ZEXT416((uint)(fVar1 * ((fVar111 - fVar44) / fVar45) * 0.99999976));
          auVar63 = vroundss_avx(auVar63,auVar63,10);
          auVar63 = vminss_avx(auVar63,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar56._0_4_ <= (uint)(int)auVar63._0_4_) {
            uVar41 = (ulong)(int)auVar56._0_4_;
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.normals.items;
            pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            pBVar7 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.dnormals.items;
            fVar45 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.maxRadiusScale;
            _fStack_1e0 = bezier_basis0._1640_8_;
            local_1e8 = (undefined1  [8])bezier_basis0._1632_8_;
            auVar56 = _local_1e8;
            auVar19 = stack0xfffffffffffffe1c;
            _fStack_1d8 = bezier_basis0._1648_8_;
            uVar20 = _fStack_1d8;
            _fStack_1d0 = bezier_basis0._1656_8_;
            uVar21 = _fStack_1d0;
            local_208 = (float)bezier_basis0._2788_8_;
            fStack_204 = SUB84(bezier_basis0._2788_8_,4);
            fStack_200 = (float)bezier_basis0._2796_8_;
            fStack_1fc = SUB84(bezier_basis0._2796_8_,4);
            _fStack_1f8 = bezier_basis0._2804_8_;
            uVar17 = _fStack_1f8;
            _fStack_1f0 = bezier_basis0._2812_8_;
            uVar18 = _fStack_1f0;
            local_178 = (float)bezier_basis0._3944_8_;
            fStack_174 = SUB84(bezier_basis0._3944_8_,4);
            fStack_170 = (float)bezier_basis0._3952_8_;
            fStack_16c = SUB84(bezier_basis0._3952_8_,4);
            _fStack_168 = bezier_basis0._3960_8_;
            uVar29 = _fStack_168;
            _fStack_160 = bezier_basis0._3968_8_;
            uVar30 = _fStack_160;
            fVar44 = SUB84(bezier_basis0._5100_8_,4);
            _local_1c8 = bezier_basis0._5100_8_;
            uVar35 = _local_1c8;
            _fStack_1c0 = bezier_basis0._5108_8_;
            uVar22 = _fStack_1c0;
            _fStack_1b8 = bezier_basis0._5116_8_;
            uVar23 = _fStack_1b8;
            _fStack_1b0 = bezier_basis0._5124_8_;
            uVar24 = _fStack_1b0;
            _local_198 = bezier_basis0._6256_8_;
            uVar25 = _local_198;
            _fStack_190 = bezier_basis0._6264_8_;
            uVar26 = _fStack_190;
            _fStack_188 = bezier_basis0._6272_8_;
            uVar27 = _fStack_188;
            _fStack_180 = bezier_basis0._6280_8_;
            uVar28 = _fStack_180;
            _local_b8 = bezier_basis0._7412_8_;
            uVar31 = _local_b8;
            _fStack_b0 = bezier_basis0._7420_8_;
            uVar32 = _fStack_b0;
            _fStack_a8 = bezier_basis0._7428_8_;
            uVar33 = _fStack_a8;
            _fStack_a0 = bezier_basis0._7436_8_;
            uVar34 = _fStack_a0;
            local_d8 = (float)bezier_basis0._8568_8_;
            fStack_d4 = SUB84(bezier_basis0._8568_8_,4);
            fStack_d0 = (float)bezier_basis0._8576_8_;
            fStack_cc = SUB84(bezier_basis0._8576_8_,4);
            fStack_c8 = (float)bezier_basis0._8584_8_;
            fStack_c4 = SUB84(bezier_basis0._8584_8_,4);
            fStack_c0 = (float)bezier_basis0._8592_8_;
            fStack_bc = SUB84(bezier_basis0._8592_8_,4);
            lVar42 = uVar41 * 0x38 + 0x10;
            auVar101._8_4_ = 0xddccb9a2;
            auVar101._0_8_ = 0xddccb9a2ddccb9a2;
            auVar101._12_4_ = 0xddccb9a2;
            auVar112._8_4_ = 0x5dccb9a2;
            auVar112._0_8_ = 0x5dccb9a25dccb9a2;
            auVar112._12_4_ = 0x5dccb9a2;
            do {
              lVar8 = *(long *)((long)pBVar4 + lVar42 + -0x10);
              lVar9 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar42);
              auVar47 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar37);
              auVar46 = vcmpps_avx(auVar47,auVar101,2);
              auVar48 = vcmpps_avx(auVar47,auVar112,5);
              auVar46 = vorps_avx(auVar46,auVar48);
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
LAB_01231023:
                auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
                _fStack_1f8 = uVar17;
                _fStack_1f0 = uVar18;
                _fStack_1d8 = uVar20;
                _fStack_1d0 = uVar21;
                _fStack_1c0 = uVar22;
                _fStack_1b8 = uVar23;
                _fStack_1b0 = uVar24;
                _local_198 = uVar25;
                _fStack_190 = uVar26;
                _fStack_188 = uVar27;
                _fStack_180 = uVar28;
                _fStack_168 = uVar29;
                _fStack_160 = uVar30;
                _local_b8 = uVar31;
                _fStack_b0 = uVar32;
                _fStack_a8 = uVar33;
                _fStack_a0 = uVar34;
                goto LAB_0123134f;
              }
              auVar46 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
              auVar48 = vcmpps_avx(auVar46,auVar101,2);
              auVar49 = vcmpps_avx(auVar46,auVar112,5);
              auVar48 = vorps_avx(auVar48,auVar49);
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') goto LAB_01231023;
              lVar8 = *(long *)((long)pBVar6 + lVar42 + -0x10);
              lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar42);
              auVar48 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar37);
              auVar49 = vcmpps_avx(auVar48,auVar101,2);
              auVar50 = vcmpps_avx(auVar48,auVar112,5);
              auVar49 = vorps_avx(auVar49,auVar50);
              if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar49[0xf] < '\0') goto LAB_01231023;
              auVar49 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
              auVar50 = vcmpps_avx(auVar49,auVar101,2);
              auVar51 = vcmpps_avx(auVar49,auVar112,5);
              auVar50 = vorps_avx(auVar50,auVar51);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') goto LAB_01231023;
              lVar8 = *(long *)((long)pBVar5 + lVar42 + -0x10);
              lVar9 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar42);
              auVar50 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar37);
              auVar51 = vcmpps_avx(auVar50,auVar101,6);
              auVar52 = vcmpps_avx(auVar50,auVar112,1);
              auVar51 = vandps_avx(auVar51,auVar52);
              uVar36 = vmovmskps_avx(auVar51);
              if ((~(byte)uVar36 & 7) != 0) goto LAB_01231023;
              auVar51 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
              auVar52 = vcmpps_avx(auVar51,auVar101,6);
              auVar54 = vcmpps_avx(auVar51,auVar112,1);
              auVar52 = vandps_avx(auVar52,auVar54);
              uVar36 = vmovmskps_avx(auVar52);
              if ((~(byte)uVar36 & 7) != 0) goto LAB_01231023;
              lVar8 = *(long *)((long)pBVar7 + lVar42 + -0x10);
              lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar42);
              auVar52 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar37);
              auVar54 = vcmpps_avx(auVar52,auVar101,6);
              auVar55 = vcmpps_avx(auVar52,auVar112,1);
              auVar54 = vandps_avx(auVar54,auVar55);
              uVar36 = vmovmskps_avx(auVar54);
              if ((~(byte)uVar36 & 7) != 0) goto LAB_01231023;
              auVar54 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar38);
              auVar101 = vcmpps_avx(auVar54,auVar101,6);
              auVar112 = vcmpps_avx(auVar54,auVar112,1);
              auVar101 = vandps_avx(auVar101,auVar112);
              uVar36 = vmovmskps_avx(auVar101);
              if ((~(byte)uVar36 & 7) != 0) goto LAB_01231023;
              auVar101 = vshufps_avx(auVar47,auVar47,0xff);
              auVar47 = vinsertps_avx(auVar47,ZEXT416((uint)(auVar101._0_4_ * fVar45)),0x30);
              auVar101 = vshufps_avx(auVar46,auVar46,0xff);
              auVar46 = vinsertps_avx(auVar46,ZEXT416((uint)(auVar101._0_4_ * fVar45)),0x30);
              auVar101 = vshufps_avx(auVar48,auVar48,0xff);
              auVar101 = vinsertps_avx(auVar48,ZEXT416((uint)(auVar101._0_4_ * fVar45)),0x30);
              auVar112 = vshufps_avx(auVar49,auVar49,0xff);
              auVar112 = vinsertps_avx(auVar49,ZEXT416((uint)(auVar112._0_4_ * fVar45)),0x30);
              fVar122 = auVar47._0_4_;
              fVar100 = fVar122 + auVar101._0_4_ * 0.33333334;
              fVar126 = auVar47._4_4_;
              fVar108 = fVar126 + auVar101._4_4_ * 0.33333334;
              fVar129 = auVar47._8_4_;
              fVar109 = fVar129 + auVar101._8_4_ * 0.33333334;
              fVar132 = auVar47._12_4_;
              fVar110 = fVar132 + auVar101._12_4_ * 0.33333334;
              auVar113._0_4_ = auVar112._0_4_ * 0.33333334;
              auVar113._4_4_ = auVar112._4_4_ * 0.33333334;
              auVar113._8_4_ = auVar112._8_4_ * 0.33333334;
              auVar113._12_4_ = auVar112._12_4_ * 0.33333334;
              auVar47 = vsubps_avx(auVar46,auVar113);
              fVar120 = auVar50._0_4_;
              fVar114 = fVar120 + auVar52._0_4_ * 0.33333334;
              fVar123 = auVar50._4_4_;
              fVar117 = fVar123 + auVar52._4_4_ * 0.33333334;
              fVar127 = auVar50._8_4_;
              fVar118 = fVar127 + auVar52._8_4_ * 0.33333334;
              fVar130 = auVar50._12_4_;
              fVar119 = fVar130 + auVar52._12_4_ * 0.33333334;
              auVar48._0_4_ = auVar54._0_4_ * 0.33333334;
              auVar48._4_4_ = auVar54._4_4_ * 0.33333334;
              auVar48._8_4_ = auVar54._8_4_ * 0.33333334;
              auVar48._12_4_ = auVar54._12_4_ * 0.33333334;
              auVar101 = vsubps_avx(auVar51,auVar48);
              fVar62 = auVar46._0_4_;
              fVar72 = auVar46._4_4_;
              fVar73 = auVar46._8_4_;
              fVar74 = auVar46._12_4_;
              fVar121 = auVar47._0_4_ * 0.0;
              fVar125 = auVar47._4_4_ * 0.0;
              fVar128 = auVar47._8_4_ * 0.0;
              fVar131 = auVar47._12_4_ * 0.0;
              fVar87 = fVar62 * 0.0 + fVar121;
              fVar96 = fVar72 * 0.0 + fVar125;
              fVar97 = fVar73 * 0.0 + fVar128;
              fVar98 = fVar74 * 0.0 + fVar131;
              fVar157 = fVar100 * 0.0;
              fVar161 = fVar108 * 0.0;
              fVar163 = fVar109 * 0.0;
              fVar165 = fVar110 * 0.0;
              local_2e8._0_4_ = fVar157 + fVar87 + fVar122;
              local_2e8._4_4_ = fVar161 + fVar96 + fVar126;
              fStack_2e0 = fVar163 + fVar97 + fVar129;
              fStack_2dc = fVar165 + fVar98 + fVar132;
              auVar88._0_4_ = fVar100 * 3.0 + fVar87;
              auVar88._4_4_ = fVar108 * 3.0 + fVar96;
              auVar88._8_4_ = fVar109 * 3.0 + fVar97;
              auVar88._12_4_ = fVar110 * 3.0 + fVar98;
              auVar102._0_4_ = fVar122 * 3.0;
              auVar102._4_4_ = fVar126 * 3.0;
              auVar102._8_4_ = fVar129 * 3.0;
              auVar102._12_4_ = fVar132 * 3.0;
              auVar54 = vsubps_avx(auVar88,auVar102);
              fVar139 = auVar51._0_4_;
              fVar145 = auVar51._4_4_;
              fVar146 = auVar51._8_4_;
              fVar147 = auVar51._12_4_;
              fVar100 = auVar101._0_4_ * 0.0;
              fVar108 = auVar101._4_4_ * 0.0;
              fVar109 = auVar101._8_4_ * 0.0;
              fVar110 = auVar101._12_4_ * 0.0;
              fVar87 = fVar139 * 0.0 + fVar100;
              fVar96 = fVar145 * 0.0 + fVar108;
              fVar97 = fVar146 * 0.0 + fVar109;
              fVar98 = fVar147 * 0.0 + fVar110;
              fVar171 = fVar114 * 0.0;
              fVar172 = fVar117 * 0.0;
              fVar173 = fVar118 * 0.0;
              fVar174 = fVar119 * 0.0;
              auVar133._0_4_ = fVar120 + fVar171 + fVar87;
              auVar133._4_4_ = fVar123 + fVar172 + fVar96;
              auVar133._8_4_ = fVar127 + fVar173 + fVar97;
              auVar133._12_4_ = fVar130 + fVar174 + fVar98;
              auVar89._0_4_ = fVar114 * 3.0 + fVar87;
              auVar89._4_4_ = fVar117 * 3.0 + fVar96;
              auVar89._8_4_ = fVar118 * 3.0 + fVar97;
              auVar89._12_4_ = fVar119 * 3.0 + fVar98;
              auVar115._0_4_ = fVar120 * 3.0;
              auVar115._4_4_ = fVar123 * 3.0;
              auVar115._8_4_ = fVar127 * 3.0;
              auVar115._12_4_ = fVar130 * 3.0;
              auVar112 = vsubps_avx(auVar89,auVar115);
              auVar64._0_4_ = fVar122 * 0.0;
              auVar64._4_4_ = fVar126 * 0.0;
              auVar64._8_4_ = fVar129 * 0.0;
              auVar64._12_4_ = fVar132 * 0.0;
              auVar155._0_4_ = auVar64._0_4_ + fVar157 + fVar62 + fVar121;
              auVar155._4_4_ = auVar64._4_4_ + fVar161 + fVar72 + fVar125;
              auVar155._8_4_ = auVar64._8_4_ + fVar163 + fVar73 + fVar128;
              auVar155._12_4_ = auVar64._12_4_ + fVar165 + fVar74 + fVar131;
              auVar76._0_4_ = fVar62 * 3.0;
              auVar76._4_4_ = fVar72 * 3.0;
              auVar76._8_4_ = fVar73 * 3.0;
              auVar76._12_4_ = fVar74 * 3.0;
              auVar90._0_4_ = auVar47._0_4_ * 3.0;
              auVar90._4_4_ = auVar47._4_4_ * 3.0;
              auVar90._8_4_ = auVar47._8_4_ * 3.0;
              auVar90._12_4_ = auVar47._12_4_ * 3.0;
              auVar47 = vsubps_avx(auVar76,auVar90);
              auVar77._0_4_ = fVar157 + auVar47._0_4_;
              auVar77._4_4_ = fVar161 + auVar47._4_4_;
              auVar77._8_4_ = fVar163 + auVar47._8_4_;
              auVar77._12_4_ = fVar165 + auVar47._12_4_;
              auVar55 = vsubps_avx(auVar77,auVar64);
              auVar78._0_4_ = fVar120 * 0.0;
              auVar78._4_4_ = fVar123 * 0.0;
              auVar78._8_4_ = fVar127 * 0.0;
              auVar78._12_4_ = fVar130 * 0.0;
              auVar65._0_4_ = auVar78._0_4_ + fVar171 + fVar139 + fVar100;
              auVar65._4_4_ = auVar78._4_4_ + fVar172 + fVar145 + fVar108;
              auVar65._8_4_ = auVar78._8_4_ + fVar173 + fVar146 + fVar109;
              auVar65._12_4_ = auVar78._12_4_ + fVar174 + fVar147 + fVar110;
              auVar91._0_4_ = fVar139 * 3.0;
              auVar91._4_4_ = fVar145 * 3.0;
              auVar91._8_4_ = fVar146 * 3.0;
              auVar91._12_4_ = fVar147 * 3.0;
              auVar49._0_4_ = auVar101._0_4_ * 3.0;
              auVar49._4_4_ = auVar101._4_4_ * 3.0;
              auVar49._8_4_ = auVar101._8_4_ * 3.0;
              auVar49._12_4_ = auVar101._12_4_ * 3.0;
              auVar47 = vsubps_avx(auVar91,auVar49);
              auVar50._0_4_ = fVar171 + auVar47._0_4_;
              auVar50._4_4_ = fVar172 + auVar47._4_4_;
              auVar50._8_4_ = fVar173 + auVar47._8_4_;
              auVar50._12_4_ = fVar174 + auVar47._12_4_;
              auVar49 = vsubps_avx(auVar50,auVar78);
              auVar47 = vshufps_avx(auVar54,auVar54,0xc9);
              auVar46 = vshufps_avx(auVar133,auVar133,0xc9);
              fVar165 = auVar54._0_4_;
              auVar92._0_4_ = fVar165 * auVar46._0_4_;
              fVar145 = auVar54._4_4_;
              auVar92._4_4_ = fVar145 * auVar46._4_4_;
              fVar147 = auVar54._8_4_;
              auVar92._8_4_ = fVar147 * auVar46._8_4_;
              fVar172 = auVar54._12_4_;
              auVar92._12_4_ = fVar172 * auVar46._12_4_;
              auVar103._0_4_ = auVar133._0_4_ * auVar47._0_4_;
              auVar103._4_4_ = auVar133._4_4_ * auVar47._4_4_;
              auVar103._8_4_ = auVar133._8_4_ * auVar47._8_4_;
              auVar103._12_4_ = auVar133._12_4_ * auVar47._12_4_;
              auVar46 = vsubps_avx(auVar103,auVar92);
              auVar101 = vshufps_avx(auVar46,auVar46,0xc9);
              auVar46 = vshufps_avx(auVar112,auVar112,0xc9);
              auVar104._0_4_ = fVar165 * auVar46._0_4_;
              auVar104._4_4_ = fVar145 * auVar46._4_4_;
              auVar104._8_4_ = fVar147 * auVar46._8_4_;
              auVar104._12_4_ = fVar172 * auVar46._12_4_;
              auVar51._0_4_ = auVar112._0_4_ * auVar47._0_4_;
              auVar51._4_4_ = auVar112._4_4_ * auVar47._4_4_;
              auVar51._8_4_ = auVar112._8_4_ * auVar47._8_4_;
              auVar51._12_4_ = auVar112._12_4_ * auVar47._12_4_;
              auVar47 = vsubps_avx(auVar51,auVar104);
              auVar112 = vshufps_avx(auVar47,auVar47,0xc9);
              auVar47 = vshufps_avx(auVar55,auVar55,0xc9);
              auVar46 = vshufps_avx(auVar65,auVar65,0xc9);
              fVar158 = auVar55._0_4_;
              auVar52._0_4_ = fVar158 * auVar46._0_4_;
              fVar162 = auVar55._4_4_;
              auVar52._4_4_ = fVar162 * auVar46._4_4_;
              fVar164 = auVar55._8_4_;
              auVar52._8_4_ = fVar164 * auVar46._8_4_;
              fVar166 = auVar55._12_4_;
              auVar52._12_4_ = fVar166 * auVar46._12_4_;
              auVar66._0_4_ = auVar65._0_4_ * auVar47._0_4_;
              auVar66._4_4_ = auVar65._4_4_ * auVar47._4_4_;
              auVar66._8_4_ = auVar65._8_4_ * auVar47._8_4_;
              auVar66._12_4_ = auVar65._12_4_ * auVar47._12_4_;
              auVar46 = vsubps_avx(auVar66,auVar52);
              auVar48 = vshufps_avx(auVar46,auVar46,0xc9);
              auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
              auVar67._0_4_ = fVar158 * auVar46._0_4_;
              auVar67._4_4_ = fVar162 * auVar46._4_4_;
              auVar67._8_4_ = fVar164 * auVar46._8_4_;
              auVar67._12_4_ = fVar166 * auVar46._12_4_;
              auVar79._0_4_ = auVar49._0_4_ * auVar47._0_4_;
              auVar79._4_4_ = auVar49._4_4_ * auVar47._4_4_;
              auVar79._8_4_ = auVar49._8_4_ * auVar47._8_4_;
              auVar79._12_4_ = auVar49._12_4_ * auVar47._12_4_;
              auVar47 = vsubps_avx(auVar79,auVar67);
              auVar49 = vshufps_avx(auVar47,auVar47,0xc9);
              auVar47 = vdpps_avx(auVar101,auVar101,0x7f);
              fVar122 = auVar47._0_4_;
              auVar51 = ZEXT416((uint)fVar122);
              auVar46 = vrsqrtss_avx(auVar51,auVar51);
              fVar62 = auVar46._0_4_;
              auVar46 = vdpps_avx(auVar101,auVar112,0x7f);
              auVar50 = ZEXT416((uint)(fVar62 * 1.5 - fVar122 * 0.5 * fVar62 * fVar62 * fVar62));
              auVar50 = vshufps_avx(auVar50,auVar50,0);
              fVar62 = auVar50._0_4_ * auVar101._0_4_;
              fVar72 = auVar50._4_4_ * auVar101._4_4_;
              fVar73 = auVar50._8_4_ * auVar101._8_4_;
              fVar74 = auVar50._12_4_ * auVar101._12_4_;
              auVar47 = vshufps_avx(auVar47,auVar47,0);
              auVar105._0_4_ = auVar47._0_4_ * auVar112._0_4_;
              auVar105._4_4_ = auVar47._4_4_ * auVar112._4_4_;
              auVar105._8_4_ = auVar47._8_4_ * auVar112._8_4_;
              auVar105._12_4_ = auVar47._12_4_ * auVar112._12_4_;
              auVar47 = vshufps_avx(auVar46,auVar46,0);
              auVar93._0_4_ = auVar47._0_4_ * auVar101._0_4_;
              auVar93._4_4_ = auVar47._4_4_ * auVar101._4_4_;
              auVar93._8_4_ = auVar47._8_4_ * auVar101._8_4_;
              auVar93._12_4_ = auVar47._12_4_ * auVar101._12_4_;
              auVar64 = vsubps_avx(auVar105,auVar93);
              auVar47 = vrcpss_avx(auVar51,auVar51);
              auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - fVar122 * auVar47._0_4_)));
              auVar112 = vshufps_avx(auVar47,auVar47,0);
              auVar46 = vdpps_avx(auVar48,auVar48,0x7f);
              auVar47 = vblendps_avx(auVar46,_DAT_01f7aa10,0xe);
              auVar101 = vrsqrtss_avx(auVar47,auVar47);
              fVar122 = auVar101._0_4_;
              auVar101 = ZEXT416((uint)(fVar122 * 1.5 -
                                       auVar46._0_4_ * 0.5 * fVar122 * fVar122 * fVar122));
              auVar51 = vshufps_avx(auVar101,auVar101,0);
              fVar122 = auVar48._0_4_ * auVar51._0_4_;
              fVar126 = auVar48._4_4_ * auVar51._4_4_;
              fVar129 = auVar48._8_4_ * auVar51._8_4_;
              fVar132 = auVar48._12_4_ * auVar51._12_4_;
              auVar101 = vdpps_avx(auVar48,auVar49,0x7f);
              auVar52 = vshufps_avx(auVar46,auVar46,0);
              auVar80._0_4_ = auVar52._0_4_ * auVar49._0_4_;
              auVar80._4_4_ = auVar52._4_4_ * auVar49._4_4_;
              auVar80._8_4_ = auVar52._8_4_ * auVar49._8_4_;
              auVar80._12_4_ = auVar52._12_4_ * auVar49._12_4_;
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar53._0_4_ = auVar101._0_4_ * auVar48._0_4_;
              auVar53._4_4_ = auVar101._4_4_ * auVar48._4_4_;
              auVar53._8_4_ = auVar101._8_4_ * auVar48._8_4_;
              auVar53._12_4_ = auVar101._12_4_ * auVar48._12_4_;
              auVar48 = vsubps_avx(auVar80,auVar53);
              auVar47 = vrcpss_avx(auVar47,auVar47);
              auVar47 = ZEXT416((uint)(auVar47._0_4_ * (2.0 - auVar46._0_4_ * auVar47._0_4_)));
              auVar47 = vshufps_avx(auVar47,auVar47,0);
              auVar46 = vshufps_avx(_local_2e8,_local_2e8,0xff);
              auVar106._0_4_ = auVar46._0_4_ * fVar62;
              auVar106._4_4_ = auVar46._4_4_ * fVar72;
              auVar106._8_4_ = auVar46._8_4_ * fVar73;
              auVar106._12_4_ = auVar46._12_4_ * fVar74;
              auVar52 = vsubps_avx(_local_2e8,auVar106);
              auVar101 = vshufps_avx(auVar54,auVar54,0xff);
              auVar68._0_4_ =
                   auVar101._0_4_ * fVar62 +
                   auVar46._0_4_ * auVar50._0_4_ * auVar112._0_4_ * auVar64._0_4_;
              auVar68._4_4_ =
                   auVar101._4_4_ * fVar72 +
                   auVar46._4_4_ * auVar50._4_4_ * auVar112._4_4_ * auVar64._4_4_;
              auVar68._8_4_ =
                   auVar101._8_4_ * fVar73 +
                   auVar46._8_4_ * auVar50._8_4_ * auVar112._8_4_ * auVar64._8_4_;
              auVar68._12_4_ =
                   auVar101._12_4_ * fVar74 +
                   auVar46._12_4_ * auVar50._12_4_ * auVar112._12_4_ * auVar64._12_4_;
              auVar112 = vsubps_avx(auVar54,auVar68);
              local_2e8._0_4_ = (float)local_2e8._0_4_ + auVar106._0_4_;
              local_2e8._4_4_ = (float)local_2e8._4_4_ + auVar106._4_4_;
              fStack_2e0 = fStack_2e0 + auVar106._8_4_;
              fStack_2dc = fStack_2dc + auVar106._12_4_;
              auVar46 = vshufps_avx(auVar155,auVar155,0xff);
              auVar107._0_4_ = auVar46._0_4_ * fVar122;
              auVar107._4_4_ = auVar46._4_4_ * fVar126;
              auVar107._8_4_ = auVar46._8_4_ * fVar129;
              auVar107._12_4_ = auVar46._12_4_ * fVar132;
              auVar49 = vsubps_avx(auVar155,auVar107);
              auVar101 = vshufps_avx(auVar55,auVar55,0xff);
              auVar54._0_4_ =
                   auVar101._0_4_ * fVar122 +
                   auVar46._0_4_ * auVar51._0_4_ * auVar48._0_4_ * auVar47._0_4_;
              auVar54._4_4_ =
                   auVar101._4_4_ * fVar126 +
                   auVar46._4_4_ * auVar51._4_4_ * auVar48._4_4_ * auVar47._4_4_;
              auVar54._8_4_ =
                   auVar101._8_4_ * fVar129 +
                   auVar46._8_4_ * auVar51._8_4_ * auVar48._8_4_ * auVar47._8_4_;
              auVar54._12_4_ =
                   auVar101._12_4_ * fVar132 +
                   auVar46._12_4_ * auVar51._12_4_ * auVar48._12_4_ * auVar47._12_4_;
              auVar47 = vsubps_avx(auVar55,auVar54);
              local_2d8._4_4_ = auVar155._4_4_ + auVar107._4_4_;
              local_2d8._0_4_ = auVar155._0_4_ + auVar107._0_4_;
              fStack_2d0 = auVar155._8_4_ + auVar107._8_4_;
              fStack_2cc = auVar155._12_4_ + auVar107._12_4_;
              auVar55._0_4_ = auVar52._0_4_ + auVar112._0_4_ * 0.33333334;
              auVar55._4_4_ = auVar52._4_4_ + auVar112._4_4_ * 0.33333334;
              auVar55._8_4_ = auVar52._8_4_ + auVar112._8_4_ * 0.33333334;
              auVar55._12_4_ = auVar52._12_4_ + auVar112._12_4_ * 0.33333334;
              auVar81._0_4_ = auVar47._0_4_ * 0.33333334;
              auVar81._4_4_ = auVar47._4_4_ * 0.33333334;
              auVar81._8_4_ = auVar47._8_4_ * 0.33333334;
              auVar81._12_4_ = auVar47._12_4_ * 0.33333334;
              auVar101 = vsubps_avx(auVar49,auVar81);
              auVar47 = vshufps_avx(auVar101,auVar101,0);
              auVar46 = vshufps_avx(auVar101,auVar101,0x55);
              auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
              auVar112 = vshufps_avx(auVar49,auVar49,0);
              auVar48 = vshufps_avx(auVar49,auVar49,0x55);
              auVar49 = vshufps_avx(auVar49,auVar49,0xaa);
              fStack_168 = (float)bezier_basis0._3960_8_;
              fStack_164 = SUB84(bezier_basis0._3960_8_,4);
              fStack_160 = (float)bezier_basis0._3968_8_;
              fVar117 = auVar112._0_4_;
              fVar118 = auVar112._4_4_;
              fVar119 = auVar112._8_4_;
              fVar121 = auVar112._12_4_;
              fVar87 = auVar48._0_4_;
              fVar96 = auVar48._4_4_;
              fVar97 = auVar48._8_4_;
              fVar98 = auVar48._12_4_;
              fVar108 = auVar49._0_4_;
              fVar109 = auVar49._4_4_;
              fVar110 = auVar49._8_4_;
              fVar114 = auVar49._12_4_;
              fStack_1f8 = (float)bezier_basis0._2804_8_;
              fStack_1f4 = SUB84(bezier_basis0._2804_8_,4);
              fStack_1f0 = (float)bezier_basis0._2812_8_;
              fVar123 = auVar47._0_4_;
              fVar130 = auVar47._4_4_;
              fVar161 = auVar47._8_4_;
              fVar173 = auVar46._0_4_;
              fVar150 = auVar46._4_4_;
              fVar152 = auVar46._8_4_;
              fVar154 = auVar46._12_4_;
              fVar139 = auVar101._0_4_;
              fVar146 = auVar101._4_4_;
              fVar171 = auVar101._8_4_;
              auVar46 = vshufps_avx(auVar55,auVar55,0);
              local_1e8._0_4_ = (undefined4)bezier_basis0._1632_8_;
              local_1e8._4_4_ = SUB84(bezier_basis0._1632_8_,4);
              fStack_1e0 = (float)bezier_basis0._1640_8_;
              fStack_1dc = SUB84(bezier_basis0._1640_8_,4);
              fStack_1d8 = (float)bezier_basis0._1648_8_;
              fStack_1d4 = SUB84(bezier_basis0._1648_8_,4);
              fStack_1d0 = (float)bezier_basis0._1656_8_;
              fVar125 = auVar46._0_4_;
              fVar128 = auVar46._4_4_;
              fVar131 = auVar46._8_4_;
              fVar120 = auVar46._12_4_;
              auVar46 = vshufps_avx(auVar55,auVar55,0x55);
              fVar174 = auVar46._0_4_;
              fVar151 = auVar46._4_4_;
              fVar153 = auVar46._8_4_;
              auVar112 = vshufps_avx(auVar55,auVar55,0xaa);
              fVar122 = auVar112._0_4_;
              fVar126 = auVar112._4_4_;
              fVar129 = auVar112._8_4_;
              fVar132 = auVar112._12_4_;
              auVar112 = vshufps_avx(auVar52,auVar52,0);
              local_268 = (float)bezier_basis0._476_8_;
              fStack_264 = SUB84(bezier_basis0._476_8_,4);
              fStack_260 = (float)bezier_basis0._484_8_;
              fStack_25c = SUB84(bezier_basis0._484_8_,4);
              fStack_258 = (float)bezier_basis0._492_8_;
              fStack_254 = SUB84(bezier_basis0._492_8_,4);
              fStack_250 = (float)bezier_basis0._500_8_;
              fVar62 = auVar112._0_4_;
              fVar72 = auVar112._4_4_;
              fVar73 = auVar112._8_4_;
              fVar74 = auVar112._12_4_;
              auVar159._0_4_ =
                   local_268 * fVar62 +
                   fVar125 * (float)local_1e8._0_4_ + fVar123 * local_208 + fVar117 * local_178;
              auVar159._4_4_ =
                   fStack_264 * fVar72 +
                   fVar128 * (float)local_1e8._4_4_ + fVar130 * fStack_204 + fVar118 * fStack_174;
              auVar159._8_4_ =
                   fStack_260 * fVar73 +
                   fVar131 * fStack_1e0 + fVar161 * fStack_200 + fVar119 * fStack_170;
              auVar159._12_4_ =
                   fStack_25c * fVar74 +
                   fVar120 * fStack_1dc + auVar47._12_4_ * fStack_1fc + fVar121 * fStack_16c;
              auVar159._16_4_ =
                   fStack_258 * fVar62 +
                   fVar125 * fStack_1d8 + fVar123 * fStack_1f8 + fVar117 * fStack_168;
              auVar159._20_4_ =
                   fStack_254 * fVar72 +
                   fVar128 * fStack_1d4 + fVar130 * fStack_1f4 + fVar118 * fStack_164;
              auVar159._24_4_ =
                   fStack_250 * fVar73 +
                   fVar131 * fStack_1d0 + fVar161 * fStack_1f0 + fVar119 * fStack_160;
              auVar159._28_4_ = fVar154 + 0.0 + 0.0;
              auVar112 = vshufps_avx(auVar52,auVar52,0x55);
              fVar127 = auVar112._0_4_;
              fVar157 = auVar112._4_4_;
              fVar163 = auVar112._8_4_;
              auVar156._0_4_ =
                   fVar174 * (float)local_1e8._0_4_ + fVar173 * local_208 + fVar87 * local_178 +
                   fVar127 * local_268;
              auVar156._4_4_ =
                   fVar151 * (float)local_1e8._4_4_ + fVar150 * fStack_204 + fVar96 * fStack_174 +
                   fVar157 * fStack_264;
              auVar156._8_4_ =
                   fVar153 * fStack_1e0 + fVar152 * fStack_200 + fVar97 * fStack_170 +
                   fVar163 * fStack_260;
              auVar156._12_4_ =
                   auVar46._12_4_ * fStack_1dc + fVar154 * fStack_1fc + fVar98 * fStack_16c +
                   auVar112._12_4_ * fStack_25c;
              auVar156._16_4_ =
                   fVar174 * fStack_1d8 + fVar173 * fStack_1f8 + fVar87 * fStack_168 +
                   fVar127 * fStack_258;
              auVar156._20_4_ =
                   fVar151 * fStack_1d4 + fVar150 * fStack_1f4 + fVar96 * fStack_164 +
                   fVar157 * fStack_254;
              auVar156._24_4_ =
                   fVar153 * fStack_1d0 + fVar152 * fStack_1f0 + fVar97 * fStack_160 +
                   fVar163 * fStack_250;
              auVar156._28_4_ = fVar154 + 0.0 + 0.0;
              auVar48 = vshufps_avx(auVar52,auVar52,0xaa);
              fVar167 = auVar48._0_4_;
              fVar169 = auVar48._4_4_;
              fVar170 = auVar48._8_4_;
              auVar69._0_4_ =
                   fVar108 * local_178 + fVar139 * local_208 + fVar122 * (float)local_1e8._0_4_ +
                   fVar167 * local_268;
              auVar69._4_4_ =
                   fVar109 * fStack_174 + fVar146 * fStack_204 + fVar126 * (float)local_1e8._4_4_ +
                   fVar169 * fStack_264;
              auVar69._8_4_ =
                   fVar110 * fStack_170 + fVar171 * fStack_200 + fVar129 * fStack_1e0 +
                   fVar170 * fStack_260;
              auVar69._12_4_ =
                   fVar114 * fStack_16c + auVar101._12_4_ * fStack_1fc + fVar132 * fStack_1dc +
                   auVar48._12_4_ * fStack_25c;
              auVar69._16_4_ =
                   fVar108 * fStack_168 + fVar139 * fStack_1f8 + fVar122 * fStack_1d8 +
                   fVar167 * fStack_258;
              auVar69._20_4_ =
                   fVar109 * fStack_164 + fVar146 * fStack_1f4 + fVar126 * fStack_1d4 +
                   fVar169 * fStack_254;
              auVar69._24_4_ =
                   fVar110 * fStack_160 + fVar171 * fStack_1f0 + fVar129 * fStack_1d0 +
                   fVar170 * fStack_250;
              auVar69._28_4_ = 0;
              local_b8 = (float)bezier_basis0._7412_8_;
              fStack_b4 = SUB84(bezier_basis0._7412_8_,4);
              fStack_b0 = (float)bezier_basis0._7420_8_;
              fStack_ac = SUB84(bezier_basis0._7420_8_,4);
              fStack_a8 = (float)bezier_basis0._7428_8_;
              fStack_a4 = SUB84(bezier_basis0._7428_8_,4);
              fStack_a0 = (float)bezier_basis0._7436_8_;
              local_198 = (float)bezier_basis0._6256_8_;
              fStack_194 = SUB84(bezier_basis0._6256_8_,4);
              fStack_190 = (float)bezier_basis0._6264_8_;
              fStack_18c = SUB84(bezier_basis0._6264_8_,4);
              fStack_188 = (float)bezier_basis0._6272_8_;
              fStack_184 = SUB84(bezier_basis0._6272_8_,4);
              fStack_180 = (float)bezier_basis0._6280_8_;
              fStack_17c = SUB84(bezier_basis0._6280_8_,4);
              fVar100 = fVar120 + fStack_bc + fVar98;
              local_1c8 = (float)bezier_basis0._5100_8_;
              fStack_1c0 = (float)bezier_basis0._5108_8_;
              fStack_1bc = SUB84(bezier_basis0._5108_8_,4);
              fStack_1b8 = (float)bezier_basis0._5116_8_;
              fStack_1b4 = SUB84(bezier_basis0._5116_8_,4);
              fStack_1b0 = (float)bezier_basis0._5124_8_;
              auVar83._0_4_ =
                   fVar62 * local_1c8 +
                   fVar125 * local_198 + local_b8 * fVar123 + local_d8 * fVar117;
              auVar83._4_4_ =
                   fVar72 * fVar44 +
                   fVar128 * fStack_194 + fStack_b4 * fVar130 + fStack_d4 * fVar118;
              auVar83._8_4_ =
                   fVar73 * fStack_1c0 +
                   fVar131 * fStack_190 + fStack_b0 * fVar161 + fStack_d0 * fVar119;
              auVar83._12_4_ =
                   fVar74 * fStack_1bc +
                   fVar120 * fStack_18c + fStack_ac * auVar47._12_4_ + fStack_cc * fVar121;
              auVar83._16_4_ =
                   fVar62 * fStack_1b8 +
                   fVar125 * fStack_188 + fStack_a8 * fVar123 + fStack_c8 * fVar117;
              auVar83._20_4_ =
                   fVar72 * fStack_1b4 +
                   fVar128 * fStack_184 + fStack_a4 * fVar130 + fStack_c4 * fVar118;
              auVar83._24_4_ =
                   fVar73 * fStack_1b0 +
                   fVar131 * fStack_180 + fStack_a0 * fVar161 + fStack_c0 * fVar119;
              auVar83._28_4_ = fVar74 + fVar120 + fStack_bc + fVar121;
              auVar58._0_4_ =
                   fVar127 * local_1c8 +
                   fVar174 * local_198 + local_b8 * fVar173 + local_d8 * fVar87;
              auVar58._4_4_ =
                   fVar157 * fVar44 +
                   fVar151 * fStack_194 + fStack_b4 * fVar150 + fStack_d4 * fVar96;
              auVar58._8_4_ =
                   fVar163 * fStack_1c0 +
                   fVar153 * fStack_190 + fStack_b0 * fVar152 + fStack_d0 * fVar97;
              auVar58._12_4_ =
                   auVar112._12_4_ * fStack_1bc +
                   auVar46._12_4_ * fStack_18c + fStack_ac * fVar154 + fStack_cc * fVar98;
              auVar58._16_4_ =
                   fVar127 * fStack_1b8 +
                   fVar174 * fStack_188 + fStack_a8 * fVar173 + fStack_c8 * fVar87;
              auVar58._20_4_ =
                   fVar157 * fStack_1b4 +
                   fVar151 * fStack_184 + fStack_a4 * fVar150 + fStack_c4 * fVar96;
              auVar58._24_4_ =
                   fVar163 * fStack_1b0 +
                   fVar153 * fStack_180 + fStack_a0 * fVar152 + fStack_c0 * fVar97;
              auVar58._28_4_ = fStack_17c + fVar100;
              auVar94._0_4_ =
                   fVar167 * local_1c8 +
                   fVar122 * local_198 + fVar139 * local_b8 + local_d8 * fVar108;
              auVar94._4_4_ =
                   fVar169 * fVar44 +
                   fVar126 * fStack_194 + fVar146 * fStack_b4 + fStack_d4 * fVar109;
              auVar94._8_4_ =
                   fVar170 * fStack_1c0 +
                   fVar129 * fStack_190 + fVar171 * fStack_b0 + fStack_d0 * fVar110;
              auVar94._12_4_ =
                   auVar48._12_4_ * fStack_1bc +
                   fVar132 * fStack_18c + auVar101._12_4_ * fStack_ac + fStack_cc * fVar114;
              auVar94._16_4_ =
                   fVar167 * fStack_1b8 +
                   fVar122 * fStack_188 + fVar139 * fStack_a8 + fStack_c8 * fVar108;
              auVar94._20_4_ =
                   fVar169 * fStack_1b4 +
                   fVar126 * fStack_184 + fVar146 * fStack_a4 + fStack_c4 * fVar109;
              auVar94._24_4_ =
                   fVar170 * fStack_1b0 +
                   fVar129 * fStack_180 + fVar171 * fStack_a0 + fStack_c0 * fVar110;
              auVar94._28_4_ = fVar100 + fVar132 + fStack_bc + fVar114;
              auVar134 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar10 = vblendps_avx(auVar83,auVar134,1);
              auVar134 = vblendps_avx(auVar58,auVar134,1);
              auVar135 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar136 = vblendps_avx(auVar94,auVar135,1);
              auVar116._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar116._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar116._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar116._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar116._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar116._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar116._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar116._28_4_ = auVar10._28_4_;
              auVar10._4_4_ = auVar134._4_4_ * 0.055555556;
              auVar10._0_4_ = auVar134._0_4_ * 0.055555556;
              auVar10._8_4_ = auVar134._8_4_ * 0.055555556;
              auVar10._12_4_ = auVar134._12_4_ * 0.055555556;
              auVar10._16_4_ = auVar134._16_4_ * 0.055555556;
              auVar10._20_4_ = auVar134._20_4_ * 0.055555556;
              auVar10._24_4_ = auVar134._24_4_ * 0.055555556;
              auVar10._28_4_ = auVar134._28_4_;
              auVar134._4_4_ = auVar136._4_4_ * 0.055555556;
              auVar134._0_4_ = auVar136._0_4_ * 0.055555556;
              auVar134._8_4_ = auVar136._8_4_ * 0.055555556;
              auVar134._12_4_ = auVar136._12_4_ * 0.055555556;
              auVar134._16_4_ = auVar136._16_4_ * 0.055555556;
              auVar134._20_4_ = auVar136._20_4_ * 0.055555556;
              auVar134._24_4_ = auVar136._24_4_ * 0.055555556;
              auVar134._28_4_ = auVar136._28_4_;
              auVar116 = vsubps_avx(auVar159,auVar116);
              auVar149 = vsubps_avx(auVar156,auVar10);
              auVar15 = vsubps_avx(auVar69,auVar134);
              auVar10 = vblendps_avx(auVar83,auVar135,0x80);
              auVar134 = vblendps_avx(auVar58,auVar135,0x80);
              auVar136 = vblendps_avx(auVar94,auVar135,0x80);
              auVar84._0_4_ = auVar159._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar84._4_4_ = auVar159._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar84._8_4_ = auVar159._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar84._12_4_ = auVar159._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar84._16_4_ = auVar159._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar84._20_4_ = auVar159._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar84._24_4_ = auVar159._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar84._28_4_ = auVar159._28_4_ + auVar10._28_4_;
              auVar59._0_4_ = auVar156._0_4_ + auVar134._0_4_ * 0.055555556;
              auVar59._4_4_ = auVar156._4_4_ + auVar134._4_4_ * 0.055555556;
              auVar59._8_4_ = auVar156._8_4_ + auVar134._8_4_ * 0.055555556;
              auVar59._12_4_ = auVar156._12_4_ + auVar134._12_4_ * 0.055555556;
              auVar59._16_4_ = auVar156._16_4_ + auVar134._16_4_ * 0.055555556;
              auVar59._20_4_ = auVar156._20_4_ + auVar134._20_4_ * 0.055555556;
              auVar59._24_4_ = auVar156._24_4_ + auVar134._24_4_ * 0.055555556;
              auVar59._28_4_ = auVar156._28_4_ + auVar134._28_4_;
              auVar95._0_4_ = auVar69._0_4_ + auVar136._0_4_ * 0.055555556;
              auVar95._4_4_ = auVar69._4_4_ + auVar136._4_4_ * 0.055555556;
              auVar95._8_4_ = auVar69._8_4_ + auVar136._8_4_ * 0.055555556;
              auVar95._12_4_ = auVar69._12_4_ + auVar136._12_4_ * 0.055555556;
              auVar95._16_4_ = auVar69._16_4_ + auVar136._16_4_ * 0.055555556;
              auVar95._20_4_ = auVar69._20_4_ + auVar136._20_4_ * 0.055555556;
              auVar95._24_4_ = auVar69._24_4_ + auVar136._24_4_ * 0.055555556;
              auVar95._28_4_ = auVar136._28_4_ + 0.0;
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar10 = vminps_avx(auVar142,auVar159);
              auVar134 = vminps_avx(auVar142,auVar156);
              auVar136 = vminps_avx(auVar116,auVar84);
              auVar135 = vminps_avx(auVar10,auVar136);
              auVar10 = vminps_avx(auVar149,auVar59);
              auVar13 = vminps_avx(auVar134,auVar10);
              auVar10 = vminps_avx(auVar142,auVar69);
              auVar134 = vminps_avx(auVar15,auVar95);
              auVar14 = vminps_avx(auVar10,auVar134);
              auVar168._0_4_ = (fVar165 + auVar68._0_4_) * 0.33333334 + (float)local_2e8._0_4_;
              auVar168._4_4_ = (fVar145 + auVar68._4_4_) * 0.33333334 + (float)local_2e8._4_4_;
              auVar168._8_4_ = (fVar147 + auVar68._8_4_) * 0.33333334 + fStack_2e0;
              auVar168._12_4_ = (fVar172 + auVar68._12_4_) * 0.33333334 + fStack_2dc;
              auVar141._0_4_ = (fVar158 + auVar54._0_4_) * 0.33333334;
              auVar141._4_4_ = (fVar162 + auVar54._4_4_) * 0.33333334;
              auVar141._8_4_ = (fVar164 + auVar54._8_4_) * 0.33333334;
              auVar141._12_4_ = (fVar166 + auVar54._12_4_) * 0.33333334;
              auVar51 = vsubps_avx(_local_2d8,auVar141);
              auVar143._8_4_ = 0xff800000;
              auVar143._0_8_ = 0xff800000ff800000;
              auVar143._12_4_ = 0xff800000;
              auVar143._16_4_ = 0xff800000;
              auVar143._20_4_ = 0xff800000;
              auVar143._24_4_ = 0xff800000;
              auVar143._28_4_ = 0xff800000;
              auVar10 = vmaxps_avx(auVar143,auVar159);
              auVar134 = vmaxps_avx(auVar143,auVar156);
              auVar136 = vmaxps_avx(auVar143,auVar69);
              auVar116 = vmaxps_avx(auVar116,auVar84);
              auVar10 = vmaxps_avx(auVar10,auVar116);
              auVar116 = vmaxps_avx(auVar149,auVar59);
              auVar134 = vmaxps_avx(auVar134,auVar116);
              auVar116 = vmaxps_avx(auVar15,auVar95);
              auVar136 = vmaxps_avx(auVar136,auVar116);
              auVar116 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar116 = vminps_avx(auVar135,auVar116);
              auVar149 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar149);
              auVar47 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar116 = vshufps_avx(auVar13,auVar13,0xb1);
              auVar116 = vminps_avx(auVar13,auVar116);
              auVar149 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar149);
              auVar46 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar46 = vunpcklps_avx(auVar47,auVar46);
              auVar116 = vshufps_avx(auVar14,auVar14,0xb1);
              auVar116 = vminps_avx(auVar14,auVar116);
              auVar149 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar149);
              auVar47 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar47 = vinsertps_avx(auVar46,auVar47,0x28);
              auVar116 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar10 = vmaxps_avx(auVar10,auVar116);
              auVar116 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar116);
              auVar46 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar10 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar10 = vmaxps_avx(auVar134,auVar10);
              auVar134 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar134);
              auVar101 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar101 = vunpcklps_avx(auVar46,auVar101);
              auVar10 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar10 = vmaxps_avx(auVar136,auVar10);
              auVar134 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar134);
              auVar46 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar46 = vinsertps_avx(auVar101,auVar46,0x28);
              auVar101 = vshufps_avx(auVar168,auVar168,0);
              auVar112 = vshufps_avx(auVar168,auVar168,0x55);
              local_f8._16_16_ = auVar112;
              local_f8._0_16_ = auVar112;
              auVar48 = vshufps_avx(auVar168,auVar168,0xaa);
              local_118._16_16_ = auVar48;
              local_118._0_16_ = auVar48;
              auVar49 = vshufps_avx(auVar51,auVar51,0);
              auVar50 = vshufps_avx(auVar51,auVar51,0x55);
              auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
              auVar52 = vshufps_avx(_local_2d8,_local_2d8,0);
              auVar54 = vshufps_avx(_local_2d8,_local_2d8,0x55);
              auVar55 = vshufps_avx(_local_2d8,_local_2d8,0xaa);
              fVar62 = auVar52._0_4_;
              fVar72 = auVar52._4_4_;
              fVar73 = auVar52._8_4_;
              fVar74 = auVar52._12_4_;
              fVar109 = auVar54._0_4_;
              fVar110 = auVar54._4_4_;
              fVar114 = auVar54._8_4_;
              fVar117 = auVar54._12_4_;
              fVar97 = auVar55._0_4_;
              fVar98 = auVar55._4_4_;
              fVar100 = auVar55._8_4_;
              fVar108 = auVar55._12_4_;
              fVar151 = auVar49._0_4_;
              fVar152 = auVar49._4_4_;
              fVar153 = auVar49._8_4_;
              fVar126 = auVar50._0_4_;
              fVar129 = auVar50._4_4_;
              fVar132 = auVar50._8_4_;
              fVar87 = auVar50._12_4_;
              fVar165 = auVar51._0_4_;
              fVar139 = auVar51._4_4_;
              fVar145 = auVar51._8_4_;
              fVar146 = auVar101._0_4_;
              fVar147 = auVar101._4_4_;
              fVar171 = auVar101._8_4_;
              fVar172 = auVar112._0_4_;
              fVar173 = auVar112._4_4_;
              fVar174 = auVar112._8_4_;
              fVar150 = auVar112._12_4_;
              fVar125 = auVar48._0_4_;
              fVar128 = auVar48._4_4_;
              fVar131 = auVar48._8_4_;
              fVar120 = auVar48._12_4_;
              auVar112 = vshufps_avx(_local_2e8,_local_2e8,0);
              fVar118 = auVar112._0_4_;
              fVar119 = auVar112._4_4_;
              fVar121 = auVar112._8_4_;
              auVar144._0_4_ =
                   fVar118 * local_268 +
                   fVar146 * (float)local_1e8._0_4_ + fVar151 * local_208 + fVar62 * local_178;
              auVar144._4_4_ =
                   fVar119 * fStack_264 +
                   fVar147 * (float)local_1e8._4_4_ + fVar152 * fStack_204 + fVar72 * fStack_174;
              auVar144._8_4_ =
                   fVar121 * fStack_260 +
                   fVar171 * fStack_1e0 + fVar153 * fStack_200 + fVar73 * fStack_170;
              auVar144._12_4_ =
                   auVar112._12_4_ * fStack_25c +
                   auVar101._12_4_ * fStack_1dc + auVar49._12_4_ * fStack_1fc + fVar74 * fStack_16c;
              auVar144._16_4_ =
                   fVar118 * fStack_258 +
                   fVar146 * fStack_1d8 + fVar151 * fStack_1f8 + fVar62 * fStack_168;
              auVar144._20_4_ =
                   fVar119 * fStack_254 +
                   fVar147 * fStack_1d4 + fVar152 * fStack_1f4 + fVar72 * fStack_164;
              auVar144._24_4_ =
                   fVar121 * fStack_250 +
                   fVar171 * fStack_1d0 + fVar153 * fStack_1f0 + fVar73 * fStack_160;
              auVar144._28_4_ = auVar135._28_4_ + -INFINITY + -INFINITY + 0.0;
              auVar48 = vshufps_avx(_local_2e8,_local_2e8,0x55);
              fVar123 = auVar48._0_4_;
              fVar127 = auVar48._4_4_;
              fVar130 = auVar48._8_4_;
              auVar160._0_4_ =
                   fVar123 * local_268 +
                   fVar172 * (float)local_1e8._0_4_ + fVar126 * local_208 + fVar109 * local_178;
              auVar160._4_4_ =
                   fVar127 * fStack_264 +
                   fVar173 * (float)local_1e8._4_4_ + fVar129 * fStack_204 + fVar110 * fStack_174;
              auVar160._8_4_ =
                   fVar130 * fStack_260 +
                   fVar174 * fStack_1e0 + fVar132 * fStack_200 + fVar114 * fStack_170;
              auVar160._12_4_ =
                   auVar48._12_4_ * fStack_25c +
                   fVar150 * fStack_1dc + fVar87 * fStack_1fc + fVar117 * fStack_16c;
              auVar160._16_4_ =
                   fVar123 * fStack_258 +
                   fVar172 * fStack_1d8 + fVar126 * fStack_1f8 + fVar109 * fStack_168;
              auVar160._20_4_ =
                   fVar127 * fStack_254 +
                   fVar173 * fStack_1d4 + fVar129 * fStack_1f4 + fVar110 * fStack_164;
              auVar160._24_4_ =
                   fVar130 * fStack_250 +
                   fVar174 * fStack_1d0 + fVar132 * fStack_1f0 + fVar114 * fStack_160;
              auVar160._28_4_ = fVar150 + auVar13._28_4_ + -INFINITY + -INFINITY;
              auVar50 = vshufps_avx(_local_2e8,_local_2e8,0xaa);
              fVar157 = auVar50._0_4_;
              fVar161 = auVar50._4_4_;
              fVar163 = auVar50._8_4_;
              auVar138._0_4_ =
                   fVar157 * local_268 +
                   fVar125 * (float)local_1e8._0_4_ + fVar165 * local_208 + fVar97 * local_178;
              auVar138._4_4_ =
                   fVar161 * fStack_264 +
                   fVar128 * (float)local_1e8._4_4_ + fVar139 * fStack_204 + fVar98 * fStack_174;
              auVar138._8_4_ =
                   fVar163 * fStack_260 +
                   fVar131 * fStack_1e0 + fVar145 * fStack_200 + fVar100 * fStack_170;
              auVar138._12_4_ =
                   auVar50._12_4_ * fStack_25c +
                   fVar120 * fStack_1dc + auVar51._12_4_ * fStack_1fc + fVar108 * fStack_16c;
              auVar138._16_4_ =
                   fVar157 * fStack_258 +
                   fVar125 * fStack_1d8 + fVar165 * fStack_1f8 + fVar97 * fStack_168;
              auVar138._20_4_ =
                   fVar161 * fStack_254 +
                   fVar128 * fStack_1d4 + fVar139 * fStack_1f4 + fVar98 * fStack_164;
              auVar138._24_4_ =
                   fVar163 * fStack_250 +
                   fVar131 * fStack_1d0 + fVar145 * fStack_1f0 + fVar100 * fStack_160;
              auVar138._28_4_ = auVar14._28_4_ + -INFINITY + -INFINITY + 0.0;
              fVar122 = fVar117 + fVar74 + fVar120;
              fVar96 = fVar117 + fVar87 + fVar117;
              auVar60._0_4_ =
                   fVar118 * local_1c8 +
                   fVar146 * local_198 + fVar151 * local_b8 + local_d8 * fVar62;
              auVar60._4_4_ =
                   fVar119 * fVar44 +
                   fVar147 * fStack_194 + fVar152 * fStack_b4 + fStack_d4 * fVar72;
              auVar60._8_4_ =
                   fVar121 * fStack_1c0 +
                   fVar171 * fStack_190 + fVar153 * fStack_b0 + fStack_d0 * fVar73;
              auVar60._12_4_ =
                   auVar112._12_4_ * fStack_1bc +
                   auVar101._12_4_ * fStack_18c + auVar49._12_4_ * fStack_ac + fStack_cc * fVar74;
              auVar60._16_4_ =
                   fVar118 * fStack_1b8 +
                   fVar146 * fStack_188 + fVar151 * fStack_a8 + fStack_c8 * fVar62;
              auVar60._20_4_ =
                   fVar119 * fStack_1b4 +
                   fVar147 * fStack_184 + fVar152 * fStack_a4 + fStack_c4 * fVar72;
              auVar60._24_4_ =
                   fVar121 * fStack_1b0 +
                   fVar171 * fStack_180 + fVar153 * fStack_a0 + fStack_c0 * fVar73;
              auVar60._28_4_ = fStack_17c + fVar122;
              auVar70._0_4_ =
                   fVar123 * local_1c8 +
                   local_198 * fVar172 + fVar126 * local_b8 + local_d8 * fVar109;
              auVar70._4_4_ =
                   fVar127 * fVar44 +
                   fStack_194 * fVar173 + fVar129 * fStack_b4 + fStack_d4 * fVar110;
              auVar70._8_4_ =
                   fVar130 * fStack_1c0 +
                   fStack_190 * fVar174 + fVar132 * fStack_b0 + fStack_d0 * fVar114;
              auVar70._12_4_ =
                   auVar48._12_4_ * fStack_1bc +
                   fStack_18c * fVar150 + fVar87 * fStack_ac + fStack_cc * fVar117;
              auVar70._16_4_ =
                   fVar123 * fStack_1b8 +
                   fStack_188 * fVar172 + fVar126 * fStack_a8 + fStack_c8 * fVar109;
              auVar70._20_4_ =
                   fVar127 * fStack_1b4 +
                   fStack_184 * fVar173 + fVar129 * fStack_a4 + fStack_c4 * fVar110;
              auVar70._24_4_ =
                   fVar130 * fStack_1b0 +
                   fStack_180 * fVar174 + fVar132 * fStack_a0 + fStack_c0 * fVar114;
              auVar70._28_4_ = fVar122 + fVar96;
              auVar85._0_4_ =
                   fVar157 * local_1c8 +
                   local_198 * fVar125 + fVar165 * local_b8 + local_d8 * fVar97;
              auVar85._4_4_ =
                   fVar161 * fVar44 +
                   fStack_194 * fVar128 + fVar139 * fStack_b4 + fStack_d4 * fVar98;
              auVar85._8_4_ =
                   fVar163 * fStack_1c0 +
                   fStack_190 * fVar131 + fVar145 * fStack_b0 + fStack_d0 * fVar100;
              auVar85._12_4_ =
                   auVar50._12_4_ * fStack_1bc +
                   fStack_18c * fVar120 + auVar51._12_4_ * fStack_ac + fStack_cc * fVar108;
              auVar85._16_4_ =
                   fVar157 * fStack_1b8 +
                   fStack_188 * fVar125 + fVar165 * fStack_a8 + fStack_c8 * fVar97;
              auVar85._20_4_ =
                   fVar161 * fStack_1b4 +
                   fStack_184 * fVar128 + fVar139 * fStack_a4 + fStack_c4 * fVar98;
              auVar85._24_4_ =
                   fVar163 * fStack_1b0 +
                   fStack_180 * fVar131 + fVar145 * fStack_a0 + fStack_c0 * fVar100;
              auVar85._28_4_ = fVar96 + fVar117 + fVar108 + fVar117;
              auVar10 = vblendps_avx(auVar60,ZEXT832(0) << 0x20,1);
              auVar134 = vblendps_avx(auVar70,ZEXT832(0) << 0x20,1);
              auVar116 = ZEXT832(0) << 0x20;
              auVar136 = vblendps_avx(auVar85,auVar116,1);
              auVar135._4_4_ = auVar10._4_4_ * 0.055555556;
              auVar135._0_4_ = auVar10._0_4_ * 0.055555556;
              auVar135._8_4_ = auVar10._8_4_ * 0.055555556;
              auVar135._12_4_ = auVar10._12_4_ * 0.055555556;
              auVar135._16_4_ = auVar10._16_4_ * 0.055555556;
              auVar135._20_4_ = auVar10._20_4_ * 0.055555556;
              auVar135._24_4_ = auVar10._24_4_ * 0.055555556;
              auVar135._28_4_ = auVar10._28_4_;
              auVar13._4_4_ = auVar134._4_4_ * 0.055555556;
              auVar13._0_4_ = auVar134._0_4_ * 0.055555556;
              auVar13._8_4_ = auVar134._8_4_ * 0.055555556;
              auVar13._12_4_ = auVar134._12_4_ * 0.055555556;
              auVar13._16_4_ = auVar134._16_4_ * 0.055555556;
              auVar13._20_4_ = auVar134._20_4_ * 0.055555556;
              auVar13._24_4_ = auVar134._24_4_ * 0.055555556;
              auVar13._28_4_ = auVar134._28_4_;
              auVar14._4_4_ = auVar136._4_4_ * 0.055555556;
              auVar14._0_4_ = auVar136._0_4_ * 0.055555556;
              auVar14._8_4_ = auVar136._8_4_ * 0.055555556;
              auVar14._12_4_ = auVar136._12_4_ * 0.055555556;
              auVar14._16_4_ = auVar136._16_4_ * 0.055555556;
              auVar14._20_4_ = auVar136._20_4_ * 0.055555556;
              auVar14._24_4_ = auVar136._24_4_ * 0.055555556;
              auVar14._28_4_ = auVar136._28_4_;
              auVar149 = vsubps_avx(auVar144,auVar135);
              auVar15 = vsubps_avx(auVar160,auVar13);
              auVar58 = vsubps_avx(auVar138,auVar14);
              auVar10 = vblendps_avx(auVar60,auVar116,0x80);
              auVar134 = vblendps_avx(auVar70,auVar116,0x80);
              auVar136 = vblendps_avx(auVar85,auVar116,0x80);
              auVar61._0_4_ = auVar144._0_4_ + auVar10._0_4_ * 0.055555556;
              auVar61._4_4_ = auVar144._4_4_ + auVar10._4_4_ * 0.055555556;
              auVar61._8_4_ = auVar144._8_4_ + auVar10._8_4_ * 0.055555556;
              auVar61._12_4_ = auVar144._12_4_ + auVar10._12_4_ * 0.055555556;
              auVar61._16_4_ = auVar144._16_4_ + auVar10._16_4_ * 0.055555556;
              auVar61._20_4_ = auVar144._20_4_ + auVar10._20_4_ * 0.055555556;
              auVar61._24_4_ = auVar144._24_4_ + auVar10._24_4_ * 0.055555556;
              auVar61._28_4_ = auVar144._28_4_ + auVar10._28_4_;
              auVar71._0_4_ = auVar160._0_4_ + auVar134._0_4_ * 0.055555556;
              auVar71._4_4_ = auVar160._4_4_ + auVar134._4_4_ * 0.055555556;
              auVar71._8_4_ = auVar160._8_4_ + auVar134._8_4_ * 0.055555556;
              auVar71._12_4_ = auVar160._12_4_ + auVar134._12_4_ * 0.055555556;
              auVar71._16_4_ = auVar160._16_4_ + auVar134._16_4_ * 0.055555556;
              auVar71._20_4_ = auVar160._20_4_ + auVar134._20_4_ * 0.055555556;
              auVar71._24_4_ = auVar160._24_4_ + auVar134._24_4_ * 0.055555556;
              auVar71._28_4_ = auVar160._28_4_ + auVar134._28_4_;
              auVar86._0_4_ = auVar138._0_4_ + auVar136._0_4_ * 0.055555556;
              auVar86._4_4_ = auVar138._4_4_ + auVar136._4_4_ * 0.055555556;
              auVar86._8_4_ = auVar138._8_4_ + auVar136._8_4_ * 0.055555556;
              auVar86._12_4_ = auVar138._12_4_ + auVar136._12_4_ * 0.055555556;
              auVar86._16_4_ = auVar138._16_4_ + auVar136._16_4_ * 0.055555556;
              auVar86._20_4_ = auVar138._20_4_ + auVar136._20_4_ * 0.055555556;
              auVar86._24_4_ = auVar138._24_4_ + auVar136._24_4_ * 0.055555556;
              auVar86._28_4_ = auVar138._28_4_ + auVar136._28_4_;
              auVar136._8_4_ = 0x7f800000;
              auVar136._0_8_ = 0x7f8000007f800000;
              auVar136._12_4_ = 0x7f800000;
              auVar136._16_4_ = 0x7f800000;
              auVar136._20_4_ = 0x7f800000;
              auVar136._24_4_ = 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar10 = vminps_avx(auVar136,auVar144);
              auVar134 = vminps_avx(auVar136,auVar160);
              auVar136 = vminps_avx(auVar136,auVar138);
              auVar116 = vminps_avx(auVar149,auVar61);
              auVar135 = vminps_avx(auVar10,auVar116);
              auVar10 = vminps_avx(auVar15,auVar71);
              auVar13 = vminps_avx(auVar134,auVar10);
              auVar10 = vminps_avx(auVar58,auVar86);
              auVar14 = vminps_avx(auVar136,auVar10);
              auVar10 = vmaxps_avx(auVar149,auVar61);
              auVar149._8_4_ = 0xff800000;
              auVar149._0_8_ = 0xff800000ff800000;
              auVar149._12_4_ = 0xff800000;
              auVar149._16_4_ = 0xff800000;
              auVar149._20_4_ = 0xff800000;
              auVar149._24_4_ = 0xff800000;
              auVar149._28_4_ = 0xff800000;
              auVar134 = vmaxps_avx(auVar149,auVar144);
              auVar10 = vmaxps_avx(auVar134,auVar10);
              auVar134 = vmaxps_avx(auVar15,auVar71);
              auVar136 = vmaxps_avx(auVar149,auVar160);
              auVar134 = vmaxps_avx(auVar136,auVar134);
              auVar136 = vmaxps_avx(auVar58,auVar86);
              auVar116 = vmaxps_avx(auVar149,auVar138);
              auVar136 = vmaxps_avx(auVar116,auVar136);
              auVar116 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar116 = vminps_avx(auVar135,auVar116);
              auVar135 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar135);
              auVar101 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar116 = vshufps_avx(auVar13,auVar13,0xb1);
              auVar116 = vminps_avx(auVar13,auVar116);
              auVar135 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar135);
              auVar112 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar112 = vunpcklps_avx(auVar101,auVar112);
              auVar116 = vshufps_avx(auVar14,auVar14,0xb1);
              auVar116 = vminps_avx(auVar14,auVar116);
              auVar135 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar135);
              auVar101 = vminps_avx(auVar116._0_16_,auVar116._16_16_);
              auVar101 = vinsertps_avx(auVar112,auVar101,0x28);
              auVar112 = vminps_avx(auVar47,auVar101);
              auVar116 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar10 = vmaxps_avx(auVar10,auVar116);
              auVar116 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar116);
              auVar47 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar10 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar10 = vmaxps_avx(auVar134,auVar10);
              auVar134 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar134);
              auVar101 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar101 = vunpcklps_avx(auVar47,auVar101);
              auVar10 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar10 = vmaxps_avx(auVar136,auVar10);
              auVar134 = vshufpd_avx(auVar10,auVar10,5);
              auVar10 = vmaxps_avx(auVar10,auVar134);
              auVar47 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
              auVar47 = vinsertps_avx(auVar101,auVar47,0x28);
              auVar46 = vmaxps_avx(auVar46,auVar47);
              auVar101._8_4_ = 0xddccb9a2;
              auVar101._0_8_ = 0xddccb9a2ddccb9a2;
              auVar101._12_4_ = 0xddccb9a2;
              auVar47 = vcmpps_avx(auVar112,auVar101,6);
              auVar112._8_4_ = 0x5dccb9a2;
              auVar112._0_8_ = 0x5dccb9a25dccb9a2;
              auVar112._12_4_ = 0x5dccb9a2;
              auVar46 = vcmpps_avx(auVar46,auVar112,1);
              auVar47 = vandps_avx(auVar46,auVar47);
              uVar36 = vmovmskps_avx(auVar47);
              if ((~(byte)uVar36 & 7) != 0) goto LAB_01231023;
              uVar41 = uVar41 + 1;
              lVar42 = lVar42 + 0x38;
            } while (uVar41 <= (ulong)(long)(int)auVar63._0_4_);
            auVar47._8_8_ = 0;
            auVar47._0_4_ =
                 (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.lower;
            auVar47._4_4_ =
                 (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.time_range.upper;
            auVar46 = ZEXT816(0) << 0x20;
            _fStack_1f8 = bezier_basis0._2804_8_;
            _fStack_1f0 = bezier_basis0._2812_8_;
            _fStack_1d8 = bezier_basis0._1648_8_;
            _fStack_1d0 = bezier_basis0._1656_8_;
            _fStack_1c0 = bezier_basis0._5108_8_;
            _fStack_1b8 = bezier_basis0._5116_8_;
            _fStack_1b0 = bezier_basis0._5124_8_;
            _local_198 = bezier_basis0._6256_8_;
            _fStack_190 = bezier_basis0._6264_8_;
            _fStack_188 = bezier_basis0._6272_8_;
            _fStack_180 = bezier_basis0._6280_8_;
            _fStack_168 = bezier_basis0._3960_8_;
            _fStack_160 = bezier_basis0._3968_8_;
            _local_b8 = bezier_basis0._7412_8_;
            _fStack_b0 = bezier_basis0._7420_8_;
            _fStack_a8 = bezier_basis0._7428_8_;
            _fStack_a0 = bezier_basis0._7436_8_;
            fStack_1c4 = fVar44;
            unique0x1000d1dd = auVar19;
          }
          auVar56 = vmovshdup_avx(auVar47);
          fVar45 = auVar47._0_4_;
          local_208 = auVar56._0_4_ - fVar45;
          local_1c8 = (fVar99 - fVar45) / local_208;
          local_208 = (fVar111 - fVar45) / local_208;
          fVar45 = fVar1 * local_1c8;
          fVar44 = fVar1 * local_208;
          auVar63 = vroundss_avx(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45),9);
          auVar101 = vroundss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),10);
          auVar56 = vmaxss_avx(auVar63,auVar46);
          local_1e8._0_4_ = auVar56._0_4_;
          auVar47 = vminss_avx(auVar101,ZEXT416((uint)fVar1));
          iVar40 = (int)auVar56._0_4_;
          fVar62 = auVar47._0_4_;
          local_1a8.primID = &local_210;
          uVar3 = (int)auVar63._0_4_;
          if ((int)auVar63._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar39 = (int)fVar1 + 1;
          if ((int)auVar101._0_4_ < (int)fVar1 + 1) {
            iVar39 = (int)auVar101._0_4_;
          }
          local_210 = uVar43;
          local_1a8.this =
               (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
                *)this;
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_138.field_1,&local_1a8,(long)iVar40);
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_158.field_1,&local_1a8,(long)(int)fVar62);
          fVar45 = fVar45 - (float)local_1e8._0_4_;
          if (iVar39 - uVar3 == 1) {
            auVar56 = vmaxss_avx(ZEXT416((uint)fVar45),ZEXT816(0) << 0x40);
            auVar47 = vshufps_avx(auVar56,auVar56,0);
            auVar56 = ZEXT416((uint)(1.0 - auVar56._0_4_));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            auVar137._0_4_ = auVar47._0_4_ * local_158.m128[0] + auVar56._0_4_ * local_138.m128[0];
            auVar137._4_4_ = auVar47._4_4_ * local_158.m128[1] + auVar56._4_4_ * local_138.m128[1];
            auVar137._8_4_ = auVar47._8_4_ * local_158.m128[2] + auVar56._8_4_ * local_138.m128[2];
            auVar137._12_4_ =
                 auVar47._12_4_ * local_158.m128[3] + auVar56._12_4_ * local_138.m128[3];
            auVar140._0_4_ = auVar47._0_4_ * local_148 + auVar56._0_4_ * local_128;
            auVar140._4_4_ = auVar47._4_4_ * fStack_144 + auVar56._4_4_ * fStack_124;
            auVar140._8_4_ = auVar47._8_4_ * fStack_140 + auVar56._8_4_ * fStack_120;
            auVar140._12_4_ = auVar47._12_4_ * fStack_13c + auVar56._12_4_ * fStack_11c;
            auVar56 = vmaxss_avx(ZEXT416((uint)(fVar62 - fVar44)),ZEXT816(0) << 0x40);
            auVar47 = vshufps_avx(auVar56,auVar56,0);
            auVar56 = ZEXT416((uint)(1.0 - auVar56._0_4_));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            auVar75._0_4_ = auVar56._0_4_ * local_158.m128[0] + auVar47._0_4_ * local_138.m128[0];
            auVar75._4_4_ = auVar56._4_4_ * local_158.m128[1] + auVar47._4_4_ * local_138.m128[1];
            auVar75._8_4_ = auVar56._8_4_ * local_158.m128[2] + auVar47._8_4_ * local_138.m128[2];
            auVar75._12_4_ = auVar56._12_4_ * local_158.m128[3] + auVar47._12_4_ * local_138.m128[3]
            ;
            auVar148._0_4_ = auVar56._0_4_ * local_148 + auVar47._0_4_ * local_128;
            auVar148._4_4_ = auVar56._4_4_ * fStack_144 + auVar47._4_4_ * fStack_124;
            auVar148._8_4_ = auVar56._8_4_ * fStack_140 + auVar47._8_4_ * fStack_120;
            auVar148._12_4_ = auVar56._12_4_ * fStack_13c + auVar47._12_4_ * fStack_11c;
          }
          else {
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_1a8,(long)(iVar40 + 1));
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_1a8,(long)((int)fVar62 + -1));
            auVar56 = vmaxss_avx(ZEXT416((uint)fVar45),ZEXT816(0) << 0x40);
            auVar47 = vshufps_avx(auVar56,auVar56,0);
            auVar56 = ZEXT416((uint)(1.0 - auVar56._0_4_));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            auVar137._0_4_ = auVar47._0_4_ * local_58.m128[0] + auVar56._0_4_ * local_138.m128[0];
            auVar137._4_4_ = auVar47._4_4_ * local_58.m128[1] + auVar56._4_4_ * local_138.m128[1];
            auVar137._8_4_ = auVar47._8_4_ * local_58.m128[2] + auVar56._8_4_ * local_138.m128[2];
            auVar137._12_4_ = auVar47._12_4_ * local_58.m128[3] + auVar56._12_4_ * local_138.m128[3]
            ;
            auVar140._0_4_ = auVar47._0_4_ * local_48 + auVar56._0_4_ * local_128;
            auVar140._4_4_ = auVar47._4_4_ * fStack_44 + auVar56._4_4_ * fStack_124;
            auVar140._8_4_ = auVar47._8_4_ * fStack_40 + auVar56._8_4_ * fStack_120;
            auVar140._12_4_ = auVar47._12_4_ * fStack_3c + auVar56._12_4_ * fStack_11c;
            auVar56 = vmaxss_avx(ZEXT416((uint)(fVar62 - fVar44)),ZEXT816(0) << 0x40);
            auVar47 = vshufps_avx(auVar56,auVar56,0);
            auVar56 = ZEXT416((uint)(1.0 - auVar56._0_4_));
            auVar56 = vshufps_avx(auVar56,auVar56,0);
            auVar75._0_4_ = auVar47._0_4_ * local_78.m128[0] + auVar56._0_4_ * local_158.m128[0];
            auVar75._4_4_ = auVar47._4_4_ * local_78.m128[1] + auVar56._4_4_ * local_158.m128[1];
            auVar75._8_4_ = auVar47._8_4_ * local_78.m128[2] + auVar56._8_4_ * local_158.m128[2];
            auVar75._12_4_ = auVar47._12_4_ * local_78.m128[3] + auVar56._12_4_ * local_158.m128[3];
            auVar148._0_4_ = auVar47._0_4_ * local_68 + auVar56._0_4_ * local_148;
            auVar148._4_4_ = auVar47._4_4_ * fStack_64 + auVar56._4_4_ * fStack_144;
            auVar148._8_4_ = auVar47._8_4_ * fStack_60 + auVar56._8_4_ * fStack_140;
            auVar148._12_4_ = auVar47._12_4_ * fStack_5c + auVar56._12_4_ * fStack_13c;
            if ((int)(uVar3 + 1) < iVar39) {
              local_198 = local_208 - local_1c8;
              itime = (size_t)(uVar3 + 1);
              iVar39 = ~uVar3 + iVar39;
              do {
                _local_1e8 = auVar148;
                auVar57._0_4_ = ((float)(int)itime / fVar1 - local_1c8) / local_198;
                auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar56 = vshufps_avx(auVar57,auVar57,0);
                local_2e8._0_4_ = auVar75._0_4_;
                local_2e8._4_4_ = auVar75._4_4_;
                fStack_2e0 = auVar75._8_4_;
                fStack_2dc = auVar75._12_4_;
                auVar47 = vshufps_avx(ZEXT416((uint)(1.0 - auVar57._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar57._0_4_)),0);
                fVar45 = auVar137._4_4_;
                fVar44 = auVar137._8_4_;
                fVar62 = auVar137._12_4_;
                local_208 = auVar56._0_4_ * (float)local_2e8._0_4_ + auVar137._0_4_ * auVar47._0_4_;
                fStack_204 = auVar56._4_4_ * (float)local_2e8._4_4_ + fVar45 * auVar47._4_4_;
                fStack_200 = auVar56._8_4_ * fStack_2e0 + fVar44 * auVar47._8_4_;
                fStack_1fc = auVar56._12_4_ * fStack_2dc + fVar62 * auVar47._12_4_;
                fVar72 = auVar140._4_4_;
                fVar73 = auVar140._8_4_;
                fVar74 = auVar140._12_4_;
                local_178 = local_1e8._0_4_ * auVar56._0_4_ + auVar140._0_4_ * auVar47._0_4_;
                fStack_174 = local_1e8._4_4_ * auVar56._4_4_ + fVar72 * auVar47._4_4_;
                fStack_170 = local_1e8._8_4_ * auVar56._8_4_ + fVar73 * auVar47._8_4_;
                fStack_16c = local_1e8._12_4_ * auVar56._12_4_ + fVar74 * auVar47._12_4_;
                ::anon_func::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_1a8,itime);
                auVar56._4_4_ = fStack_204;
                auVar56._0_4_ = local_208;
                auVar56._8_4_ = fStack_200;
                auVar56._12_4_ = fStack_1fc;
                auVar56 = vsubps_avx((undefined1  [16])local_98,auVar56);
                auVar16._4_4_ = fStack_174;
                auVar16._0_4_ = local_178;
                auVar16._8_4_ = fStack_170;
                auVar16._12_4_ = fStack_16c;
                auVar46 = vsubps_avx(local_88,auVar16);
                auVar47 = vminps_avx(auVar56,ZEXT816(0) << 0x40);
                auVar56 = vmaxps_avx(auVar46,ZEXT816(0) << 0x40);
                auVar137._0_4_ = auVar137._0_4_ + auVar47._0_4_;
                auVar137._4_4_ = fVar45 + auVar47._4_4_;
                auVar137._8_4_ = fVar44 + auVar47._8_4_;
                auVar137._12_4_ = fVar62 + auVar47._12_4_;
                auVar75._0_4_ = (float)local_2e8._0_4_ + auVar47._0_4_;
                auVar75._4_4_ = (float)local_2e8._4_4_ + auVar47._4_4_;
                auVar75._8_4_ = fStack_2e0 + auVar47._8_4_;
                auVar75._12_4_ = fStack_2dc + auVar47._12_4_;
                auVar140._0_4_ = auVar140._0_4_ + auVar56._0_4_;
                auVar140._4_4_ = fVar72 + auVar56._4_4_;
                auVar140._8_4_ = fVar73 + auVar56._8_4_;
                auVar140._12_4_ = fVar74 + auVar56._12_4_;
                auVar148._0_4_ = (float)local_1e8._0_4_ + auVar56._0_4_;
                auVar148._4_4_ = (float)local_1e8._4_4_ + auVar56._4_4_;
                auVar148._8_4_ = fStack_1e0 + auVar56._8_4_;
                auVar148._12_4_ = fStack_1dc + auVar56._12_4_;
                itime = itime + 1;
                iVar39 = iVar39 + -1;
              } while (iVar39 != 0);
            }
          }
          auVar124 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar56 = vcmpps_avx(auVar137,auVar140,2);
          uVar36 = vmovmskps_avx(auVar56);
          auVar56 = _local_1e8;
          uVar35 = _local_1c8;
          if ((~(byte)uVar36 & 7) == 0) {
            auVar47 = vcmpps_avx(auVar75,auVar148,2);
            uVar36 = vmovmskps_avx(auVar47);
            if ((~(byte)uVar36 & 7) == 0) {
              auVar47 = vminps_avx(auVar137,auVar75);
              aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar47,ZEXT416(geomID),0x30);
              auVar47 = vmaxps_avx(auVar140,auVar148);
              aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar47,ZEXT416((uint)uVar43),0x30);
              auVar82._0_4_ = aVar11.x + aVar12.x;
              auVar82._4_4_ = aVar11.y + aVar12.y;
              auVar82._8_4_ = aVar11.z + aVar12.z;
              auVar82._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
              local_2a8 = vminps_avx(local_2a8,(undefined1  [16])aVar11);
              local_298 = vmaxps_avx(local_298,(undefined1  [16])aVar12);
              local_278 = vminps_avx(local_278,auVar82);
              local_288 = vmaxps_avx(local_288,auVar82);
              local_2c0 = local_2c0 + 1;
              prims[local_2b0].lower.field_0.field_1 = aVar11;
              prims[local_2b0].upper.field_0.field_1 = aVar12;
              local_2b0 = local_2b0 + 1;
            }
          }
        }
LAB_0123134f:
        _local_1c8 = uVar35;
        _local_1e8 = auVar56;
        uVar43 = uVar43 + 1;
      } while (uVar43 < r->_end);
    }
    else {
      local_2c0 = 0;
      local_298._8_4_ = 0xff800000;
      local_298._0_8_ = 0xff800000ff800000;
      local_298._12_4_ = 0xff800000;
      local_2a8._8_4_ = 0x7f800000;
      local_2a8._0_8_ = 0x7f8000007f800000;
      local_2a8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_2a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_2a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_298._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_298._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_278._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_278._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_288._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_288._8_8_;
    __return_storage_ptr__->end = local_2c0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }